

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,point_style style,double *Point)

{
  double *__dest;
  double dVar1;
  bool bVar2;
  int local_5c;
  double local_58;
  double *cv;
  double w;
  int k;
  bool rc;
  double *Point_local;
  point_style style_local;
  int i_local;
  ON_BezierCurve *this_local;
  
  this_local._7_1_ = true;
  if (((this->m_cv == (double *)0x0) || (i < 0)) || (this->m_order <= i)) {
    this_local._7_1_ = false;
  }
  else {
    __dest = this->m_cv + i * this->m_cv_stride;
    switch(style) {
    case not_rational:
      memcpy(__dest,Point,(long)this->m_dim << 3);
      bVar2 = IsRational(this);
      if (bVar2) {
        __dest[this->m_dim] = 1.0;
      }
      break;
    case homogeneous_rational:
      bVar2 = IsRational(this);
      if (bVar2) {
        memcpy(__dest,Point,(long)(this->m_dim + 1) << 3);
      }
      else {
        if ((Point[this->m_dim] != 0.0) || (NAN(Point[this->m_dim]))) {
          local_58 = 1.0 / Point[this->m_dim];
        }
        else {
          local_58 = 1.0;
        }
        for (w._0_4_ = 0; w._0_4_ < this->m_dim; w._0_4_ = w._0_4_ + 1) {
          __dest[w._0_4_] = local_58 * Point[w._0_4_];
        }
      }
      break;
    case euclidean_rational:
      bVar2 = IsRational(this);
      if (bVar2) {
        dVar1 = Point[this->m_dim];
        for (w._0_4_ = 0; w._0_4_ < this->m_dim; w._0_4_ = w._0_4_ + 1) {
          __dest[w._0_4_] = dVar1 * Point[w._0_4_];
        }
        __dest[this->m_dim] = dVar1;
      }
      else {
        memcpy(__dest,Point,(long)this->m_dim << 3);
      }
      break;
    case intrinsic_point_style:
      if (this->m_is_rat == 0) {
        local_5c = this->m_dim;
      }
      else {
        local_5c = this->m_dim + 1;
      }
      memcpy(__dest,Point,(long)local_5c << 3);
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BezierCurve::SetCV( int i, ON::point_style style, const double* Point )
{
  bool rc = true;
  int k;
  double w;

  // feeble but fast check for properly initialized class
  if ( !m_cv || i < 0 || i >= m_order )
    return false;

  double* cv = m_cv + i*m_cv_stride;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS curve is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS curve is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS curve is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( k = 0; k < m_dim; k++ ) {
        cv[k] = w*Point[k];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS curve is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( k = 0; k < m_dim; k++ )
        cv[k] = w*Point[k];
      cv[m_dim] = w;
    }
    else {
      // NURBS curve is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    k = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,k*sizeof(cv[0]));
    break;

  default:
    rc = false;
    break;
  }

  return rc;
}